

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BpTree2.h
# Opt level: O0

void __thiscall BpTree<float>::Insert_Leaf(BpTree<float> *this,IndexNode<float> *C,float k,Addr p)

{
  value_type vVar1;
  value_type vVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  bool bVar7;
  int local_a0;
  int local_9c;
  int j;
  int i;
  int pos;
  IndexNode<float> local_88;
  value_type local_24;
  IndexNode<float> *pIStack_20;
  float k_local;
  IndexNode<float> *C_local;
  BpTree<float> *this_local;
  Addr p_local;
  
  local_24 = k;
  pIStack_20 = C;
  C_local = (IndexNode<float> *)this;
  this_local = (BpTree<float> *)p;
  IndexNode<float>::IndexNode(&local_88,C);
  LockNode(this,&local_88);
  IndexNode<float>::~IndexNode(&local_88);
  local_9c = 0;
  while( true ) {
    bVar7 = false;
    if (local_9c < this->N) {
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&pIStack_20->v,(long)local_9c);
      bVar7 = *pvVar3 == '1';
    }
    if (!bVar7) break;
    local_9c = local_9c + 1;
  }
  j = 0;
  while( true ) {
    bVar7 = false;
    if (j < this->N) {
      pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&pIStack_20->v,(long)j);
      bVar7 = false;
      if (*pvVar3 == '1') {
        pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&pIStack_20->k,(long)j);
        bVar7 = *pvVar4 < local_24;
      }
    }
    if (!bVar7) break;
    j = j + 1;
  }
  for (local_a0 = local_9c; vVar1 = local_24, j < local_a0; local_a0 = local_a0 + -1) {
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[]
                       (&pIStack_20->v,(long)(local_a0 + -1));
    vVar2 = *pvVar3;
    pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&pIStack_20->v,(long)local_a0);
    *pvVar3 = vVar2;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                       (&pIStack_20->k,(long)(local_a0 + -1));
    vVar1 = *pvVar4;
    pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&pIStack_20->k,(long)local_a0);
    *pvVar4 = vVar1;
    pvVar5 = std::vector<Addr,_std::allocator<Addr>_>::operator[]
                       (&pIStack_20->p,(long)(local_a0 + -1));
    pvVar6 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&pIStack_20->p,(long)local_a0);
    *pvVar6 = *pvVar5;
  }
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[](&pIStack_20->k,(long)j);
  *pvVar4 = vVar1;
  pvVar5 = std::vector<Addr,_std::allocator<Addr>_>::operator[](&pIStack_20->p,(long)j);
  *pvVar5 = (value_type)this_local;
  pvVar3 = std::vector<char,_std::allocator<char>_>::operator[](&pIStack_20->v,(long)j);
  *pvVar3 = '1';
  return;
}

Assistant:

void BpTree<K>::Insert_Leaf(IndexNode<K>& C, K k, Addr p) {
	this->LockNode(C);
	//�õ���Ӧ��ַ�����ã���C�޸ļ��ɶ�ԭ���޸�
	int pos, i, j;
	for (i = 0; i < N && C.v[i] == '1'; i++);							//��iλ���п�
	for (pos = 0; pos < N && C.v[pos] == '1' && C.k[pos] < k; pos++);	//pos���Ժ���Ҫ��Ǩ
	for (j = i; j > pos; j--) {
		C.v[j] = C.v[j - 1];
		C.k[j] = C.k[j - 1];
		C.p[j] = C.p[j - 1];
	}
	C.k[pos] = k;
	C.p[pos] = p;
	C.v[pos] = '1';
}